

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_ManExtractGroupInt
               (Cba_Ntk_t *pNew,Cba_Ntk_t *p,Vec_Int_t *vObjs,Vec_Int_t *vFonIns,Vec_Int_t *vFonOuts
               )

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  
  uVar9 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar9) {
    piVar6 = (p->vObjCopy).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar9 << 2);
    }
    (p->vObjCopy).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_003d9219;
    (p->vObjCopy).nCap = uVar9;
  }
  if (0 < (int)uVar9) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar9 * 4);
  }
  (p->vObjCopy).nSize = uVar9;
  uVar9 = (p->vFonObj).nCap;
  if ((p->vFonCopy).nCap < (int)uVar9) {
    piVar6 = (p->vFonCopy).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar9 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar9 << 2);
    }
    (p->vFonCopy).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_003d9219:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vFonCopy).nCap = uVar9;
  }
  if (0 < (int)uVar9) {
    memset((p->vFonCopy).pArray,0,(ulong)uVar9 * 4);
  }
  (p->vFonCopy).nSize = uVar9;
  if (0 < vFonIns->nSize) {
    lVar14 = 0;
    do {
      uVar9 = vFonIns->pArray[lVar14];
      uVar5 = Cba_ObjAlloc(pNew,CBA_OBJ_PI,0,1);
      if ((int)uVar5 < 1) goto LAB_003d918b;
      if ((pNew->vObjFon0).nSize <= (int)uVar5) goto LAB_003d90de;
      if ((int)uVar9 < 1) goto LAB_003d9125;
      if ((p->vFonCopy).nSize <= (int)uVar9) goto LAB_003d90de;
      piVar6 = (p->vFonCopy).pArray;
      if (piVar6[uVar9] != 0) goto LAB_003d911c;
      piVar6[uVar9] = (pNew->vObjFon0).pArray[uVar5];
      if (0 < (p->vObjName).nSize) {
        if ((p->vFonObj).nSize <= (int)uVar9) goto LAB_003d90de;
        iVar8 = (p->vFonObj).pArray[uVar9];
        if ((long)iVar8 < 1) goto LAB_003d91aa;
        Vec_IntFillExtra(&p->vObjName,iVar8 + 1,0);
        if ((p->vObjName).nSize <= iVar8) goto LAB_003d90de;
        Cba_ObjSetName(pNew,uVar5,(p->vObjName).pArray[iVar8]);
      }
      if (0 < (p->vFonName).nSize) {
        if ((pNew->vObjFon0).nSize <= (int)uVar5) goto LAB_003d90de;
        iVar8 = (pNew->vObjFon0).pArray[uVar5];
        Vec_IntFillExtra(&p->vFonName,uVar9 + 1,0);
        if ((p->vFonName).nSize <= (int)uVar9) goto LAB_003d90de;
        Cba_FonSetName(pNew,iVar8,(p->vFonName).pArray[uVar9]);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < vFonIns->nSize);
  }
  if (0 < vObjs->nSize) {
    lVar14 = 0;
    do {
      uVar9 = vObjs->pArray[lVar14];
      uVar5 = Cba_ObjDup(pNew,p,uVar9);
      if ((p->vObjName).nSize < 1) {
        if ((int)uVar9 < 1) {
LAB_003d918b:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
        }
      }
      else {
        if ((int)uVar9 < 1) {
LAB_003d91aa:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(&p->vObjName,uVar9 + 1,0);
        if ((p->vObjName).nSize <= (int)uVar9) goto LAB_003d90de;
        Cba_ObjSetName(pNew,uVar5,(p->vObjName).pArray[uVar9]);
      }
      uVar1 = (p->vObjFon0).nSize;
      if (((int)uVar1 <= (int)uVar9) || (uVar1 <= uVar9 + 1)) goto LAB_003d90de;
      uVar1 = (p->vObjFon0).pArray[uVar9];
      uVar10 = (ulong)uVar1;
      iVar8 = 0;
      while (iVar13 = (int)uVar10, iVar13 < (p->vObjFon0).pArray[(ulong)uVar9 + 1]) {
        if ((int)uVar5 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xea,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
        }
        if ((pNew->vObjFon0).nSize <= (int)uVar5) goto LAB_003d90de;
        if ((int)uVar1 < 1) goto LAB_003d9125;
        if ((p->vFonCopy).nSize <= iVar13) goto LAB_003d90de;
        piVar6 = (p->vFonCopy).pArray;
        if (piVar6[uVar10] != 0) goto LAB_003d911c;
        piVar4 = (pNew->vObjFon0).pArray;
        piVar6[uVar10] = piVar4[uVar5] + iVar8;
        if (0 < (p->vFonName).nSize) {
          if ((pNew->vObjFon0).nSize <= (int)uVar5) goto LAB_003d90de;
          iVar2 = piVar4[uVar5];
          Vec_IntFillExtra(&p->vFonName,iVar13 + 1,0);
          if ((p->vFonName).nSize <= iVar13) goto LAB_003d90de;
          Cba_FonSetName(pNew,iVar2 + iVar8,(p->vFonName).pArray[uVar10]);
        }
        uVar10 = uVar10 + 1;
        iVar8 = iVar8 + 1;
        if ((p->vObjFon0).nSize <= (int)(uVar9 + 1)) goto LAB_003d90de;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < vObjs->nSize);
    if (0 < vObjs->nSize) {
      lVar14 = 0;
      do {
        uVar9 = vObjs->pArray[lVar14];
        if ((int)uVar9 < 1) {
          pcVar11 = "i>0";
LAB_003d9201:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0xee,"int Cba_ObjCopy(Cba_Ntk_t *, int)");
        }
        if ((p->vObjCopy).nSize < 1) {
          pcVar11 = "Cba_NtkHasObjCopies(p)";
          goto LAB_003d9201;
        }
        uVar5 = uVar9 + 1;
        Vec_IntFillExtra(&p->vObjCopy,uVar5,-1);
        if ((((p->vObjCopy).nSize <= (int)uVar9) ||
            (uVar1 = (p->vObjFin0).nSize, (int)uVar1 <= (int)uVar9)) || (uVar1 <= uVar5))
        goto LAB_003d90de;
        uVar1 = (p->vObjCopy).pArray[uVar9];
        piVar6 = (p->vObjFin0).pArray;
        uVar3 = piVar6[uVar9];
        uVar10 = (ulong)uVar3;
        iVar8 = 0;
        while ((int)uVar10 < piVar6[(ulong)uVar9 + 1]) {
          if ((int)uVar3 < 1) goto LAB_003d90fd;
          if ((p->vFinFon).nSize <= (int)uVar10) goto LAB_003d90de;
          iVar13 = (p->vFinFon).pArray[uVar10];
          if (0 < (long)iVar13) {
            if ((p->vFonCopy).nSize <= iVar13) goto LAB_003d90de;
            iVar13 = (p->vFonCopy).pArray[iVar13];
          }
          if ((int)uVar1 < 1) goto LAB_003d9163;
          if ((pNew->vObjFin0).nSize <= (int)uVar1) goto LAB_003d90de;
          uVar12 = (pNew->vObjFin0).pArray[uVar1] + iVar8;
          if ((int)uVar12 < 1) goto LAB_003d90fd;
          if ((pNew->vFinFon).nSize <= (int)uVar12) goto LAB_003d90de;
          piVar4 = (pNew->vFinFon).pArray;
          if (piVar4[uVar12] != 0) goto LAB_003d916c;
          piVar4[uVar12] = iVar13;
          uVar10 = uVar10 + 1;
          iVar8 = iVar8 + 1;
          if ((p->vObjFin0).nSize <= (int)uVar5) goto LAB_003d90de;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < vObjs->nSize);
    }
  }
  if (0 < vFonOuts->nSize) {
    lVar14 = 0;
    do {
      uVar9 = vFonOuts->pArray[lVar14];
      uVar5 = Cba_ObjAlloc(pNew,CBA_OBJ_PO,1,0);
      if ((p->vObjName).nSize < 1) {
        if (0 < (int)uVar9) goto LAB_003d902c;
      }
      else {
        if ((p->vFonName).nSize < 1) {
          pcVar11 = "Cba_NtkHasFonNames(p)";
LAB_003d91d9:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x11d,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        if ((int)uVar9 < 1) {
          pcVar11 = "Cba_FonIsReal(f)";
          goto LAB_003d91d9;
        }
        Vec_IntFillExtra(&p->vFonName,uVar9 + 1,0);
        if ((p->vFonName).nSize <= (int)uVar9) {
LAB_003d90de:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Cba_ObjSetName(pNew,uVar5,(p->vFonName).pArray[uVar9]);
LAB_003d902c:
        if ((p->vFonCopy).nSize <= (int)uVar9) goto LAB_003d90de;
        uVar9 = (p->vFonCopy).pArray[uVar9];
      }
      if ((int)uVar5 < 1) goto LAB_003d9163;
      if ((pNew->vObjFin0).nSize <= (int)uVar5) goto LAB_003d90de;
      iVar8 = (pNew->vObjFin0).pArray[uVar5];
      lVar7 = (long)iVar8;
      if (lVar7 < 1) {
LAB_003d90fd:
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((pNew->vFinFon).nSize <= iVar8) goto LAB_003d90de;
      piVar6 = (pNew->vFinFon).pArray;
      if (piVar6[lVar7] != 0) goto LAB_003d916c;
      piVar6[lVar7] = uVar9;
      lVar14 = lVar14 + 1;
    } while (lVar14 < vFonOuts->nSize);
  }
  if ((pNew->vObjType).nSize != (pNew->vObjType).nCap) {
    __assert_fail("Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bb,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if ((pNew->vFinFon).nSize != (pNew->vFinFon).nCap) {
    __assert_fail("Cba_NtkFinNum(pNew) == Cba_NtkFinNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bc,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if ((pNew->vFonObj).nSize != (pNew->vFonObj).nCap) {
    __assert_fail("Cba_NtkFonNum(pNew) == Cba_NtkFonNumAlloc(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3bd,
                  "void Cba_ManExtractGroupInt(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  return;
LAB_003d9125:
  pcVar11 = "Cba_FonIsReal(f)";
  goto LAB_003d912c;
LAB_003d9163:
  pcVar11 = "i>0";
  goto LAB_003d9173;
LAB_003d911c:
  pcVar11 = "Cba_FonCopy(p, f) == 0";
LAB_003d912c:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0x11c,"void Cba_FonSetCopy(Cba_Ntk_t *, int, int)");
LAB_003d916c:
  pcVar11 = "Cba_ObjFinFon(p, i, k)== 0";
LAB_003d9173:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0x101,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
}

Assistant:

void Cba_ManExtractGroupInt( Cba_Ntk_t * pNew, Cba_Ntk_t * p, Vec_Int_t * vObjs, Vec_Int_t * vFonIns, Vec_Int_t * vFonOuts )
{
    int i, k, iObj, iObjNew, iFin, iFon;
    Cba_NtkCleanObjCopies( p );
    Cba_NtkCleanFonCopies( p );
    // create inputs and map fons
    Vec_IntForEachEntry( vFonIns, iFon, i )
    {
        iObjNew = Cba_ObjAlloc( pNew, CBA_OBJ_PI, 0, 1 );
        Cba_FonSetCopy( p, iFon, Cba_ObjFon0(pNew, iObjNew) );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_ObjName(p, Cba_FonObj(p, iFon)) );
        if ( Cba_NtkHasFonNames(p) )
            Cba_FonSetName( pNew, Cba_ObjFon0(pNew, iObjNew), Cba_FonName(p, iFon) );

    }
    // create internal
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjDup( pNew, p, iObj );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_ObjName(p, iObj) );
        Cba_ObjForEachFon( p, iObj, iFon, k )
        {
            Cba_FonSetCopy( p, iFon, Cba_ObjFon(pNew, iObjNew, k) );
            if ( Cba_NtkHasFonNames(p) )
                Cba_FonSetName( pNew, Cba_ObjFon(pNew, iObjNew, k), Cba_FonName(p, iFon) );
        }
    }
    // connect internal
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        iObjNew = Cba_ObjCopy( p, iObj );
        Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
            Cba_ObjSetFinFon( pNew, iObjNew, k, Cba_FonCopy(p, iFon) );
    }
    // create POs
    Vec_IntForEachEntry( vFonOuts, iFon, i )
    {
        iObjNew = Cba_ObjAlloc( pNew, CBA_OBJ_PO, 1, 0 );
        if ( Cba_NtkHasObjNames(p) )
            Cba_ObjSetName( pNew, iObjNew, Cba_FonName(p, iFon) );
        Cba_ObjSetFinFon( pNew, iObjNew, 0, Cba_FonCopy(p, iFon) );
    }
    assert( Cba_NtkObjNum(pNew) == Cba_NtkObjNumAlloc(pNew) );
    assert( Cba_NtkFinNum(pNew) == Cba_NtkFinNumAlloc(pNew) );
    assert( Cba_NtkFonNum(pNew) == Cba_NtkFonNumAlloc(pNew) );
}